

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# midi2chords.cpp
# Opt level: O2

void printChordSequence(vector<Sonority,_std::allocator<Sonority>_> *chordSequence)

{
  pointer pSVar1;
  ostream *poVar2;
  int i;
  long lVar3;
  long lVar4;
  
  lVar4 = 0;
  for (lVar3 = 0;
      pSVar1 = (chordSequence->super__Vector_base<Sonority,_std::allocator<Sonority>_>)._M_impl.
               super__Vector_impl_data._M_start,
      lVar3 < (int)(((long)(chordSequence->super__Vector_base<Sonority,_std::allocator<Sonority>_>).
                           _M_impl.super__Vector_impl_data._M_finish - (long)pSVar1) / 0xb0);
      lVar3 = lVar3 + 1) {
    poVar2 = std::ostream::_M_insert<double>(*(double *)((long)&pSVar1->qstamp + lVar4));
    std::operator<<(poVar2,"\t");
    poVar2 = std::ostream::_M_insert<double>
                       (*(double *)
                         ((long)&((chordSequence->
                                  super__Vector_base<Sonority,_std::allocator<Sonority>_>)._M_impl.
                                  super__Vector_impl_data._M_start)->qdur + lVar4));
    std::operator<<(poVar2,":\t");
    printPcInfo((Sonority *)
                ((long)&((chordSequence->super__Vector_base<Sonority,_std::allocator<Sonority>_>).
                         _M_impl.super__Vector_impl_data._M_start)->qstamp + lVar4));
    poVar2 = std::operator<<((ostream *)&std::cout,":\t");
    std::operator<<(poVar2,(string *)
                           ((long)&(((chordSequence->
                                     super__Vector_base<Sonority,_std::allocator<Sonority>_>).
                                     _M_impl.super__Vector_impl_data._M_start)->root)._M_dataplus.
                                   _M_p + lVar4));
    poVar2 = std::operator<<((ostream *)&std::cout,"\t");
    std::operator<<(poVar2,(string *)
                           ((long)&(((chordSequence->
                                     super__Vector_base<Sonority,_std::allocator<Sonority>_>).
                                     _M_impl.super__Vector_impl_data._M_start)->quality)._M_dataplus
                                   ._M_p + lVar4));
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    lVar4 = lVar4 + 0xb0;
  }
  return;
}

Assistant:

void printChordSequence(vector<Sonority>& chordSequence) {
	vector<Sonority>& cs = chordSequence;
	for (int i=0; i<(int)cs.size(); i++) {
		cout << cs[i].qstamp << "\t" << cs[i].qdur << ":\t";
		printPcInfo(cs[i]);
		cout << ":\t" << cs[i].root;
		cout << "\t" << cs[i].quality;
		cout << endl;
	}
}